

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tvrq_api.c
# Opt level: O3

int RqOutExecute(RqOutProgram *pcOutProgMem,size_t nSymSize,void *pcInterSymMem,void *pOutSymMem,
                size_t nOutSymMemSize)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  m256v I;
  m256v O;
  tuple local_78;
  m256v local_60;
  m256v local_48;
  
  uVar1 = (long)pcOutProgMem->nESI * nSymSize;
  if (uVar1 < nOutSymMemSize || uVar1 - nOutSymMemSize == 0) {
    m256v_make(&local_48,pcOutProgMem->nESI,(int)nSymSize,(uint8_t *)pOutSymMem);
    m256v_make(&local_60,(pcOutProgMem->params).L,(int)nSymSize,(uint8_t *)pcInterSymMem);
    if (0 < pcOutProgMem->nESI) {
      lVar4 = 0;
      do {
        tuple_generate_from_ESI(&local_78,(&pcOutProgMem[1].params.K)[lVar4],&pcOutProgMem->params);
        iVar3 = (int)lVar4;
        m256v_copy_row(&local_60,local_78.b,&local_48,iVar3);
        if (1 < local_78.d) {
          iVar2 = 1;
          do {
            local_78.b = (local_78.a + local_78.b) % (pcOutProgMem->params).W;
            m256v_multadd_row(&local_60,local_78.b,'\x01',&local_48,iVar3);
            iVar2 = iVar2 + 1;
          } while (iVar2 < local_78.d);
        }
        iVar2 = (pcOutProgMem->params).P;
        if (iVar2 <= local_78.b1) {
          do {
            local_78.b1 = (local_78.b1 + local_78.a1) % (pcOutProgMem->params).P1;
          } while (iVar2 <= local_78.b1);
        }
        m256v_multadd_row(&local_60,local_78.b1 + (pcOutProgMem->params).W,'\x01',&local_48,iVar3);
        if (1 < local_78.d1) {
          iVar2 = 1;
          do {
            do {
              local_78.b1 = (local_78.b1 + local_78.a1) % (pcOutProgMem->params).P1;
            } while ((pcOutProgMem->params).P <= local_78.b1);
            m256v_multadd_row(&local_60,(pcOutProgMem->params).W + local_78.b1,'\x01',&local_48,
                              iVar3);
            iVar2 = iVar2 + 1;
          } while (iVar2 < local_78.d1);
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < pcOutProgMem->nESI);
    }
    iVar3 = 0;
  }
  else {
    RqOutExecute_cold_1();
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

int RqOutExecute(const RqOutProgram* pcOutProgMem,
		 size_t nSymSize,
		 const void* pcInterSymMem,
		 void* pOutSymMem,
		 size_t nOutSymMemSize)
{
	/* Check memory limitations */
	if (nOutSymMemSize < pcOutProgMem->nESI * nSymSize) {
		errmsg("Not enough space for generated symbols.");
		return RQ_ERR_ENOMEM;
	}

	/* Create matrices */
	const parameters* P = &pcOutProgMem->params;
	m256v O = m256v_make(pcOutProgMem->nESI, nSymSize, pOutSymMem);
	m256v I = m256v_make(P->L, nSymSize, (void*)pcInterSymMem);

	/* Generate symbols */
	for (int i = 0; i < pcOutProgMem->nESI; ++i) {
		// Sect 5.3.5.3
		tuple T = tuple_generate_from_ESI(
				pcOutProgMem->ESIs[i], P);
		m256v_copy_row(&I, T.b, &O, i);
		for (int j = 1; j < T.d; ++j) {
			T.b = (T.b + T.a) % P->W;
			m256v_multadd_row(&I, T.b, 1, &O, i);
		}
		while (T.b1 >= P->P)
			T.b1 = (T.b1 + T.a1) % P->P1;
		m256v_multadd_row(&I, P->W + T.b1, 1, &O, i);
		for (int j = 1; j < T.d1; ++j) {
			do {
				T.b1 = (T.b1 + T.a1) % P->P1;
			} while(T.b1 >= P->P);
			m256v_multadd_row(&I, P->W + T.b1, 1, &O, i);
		}
	}

	return 0;
}